

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi.cpp
# Opt level: O0

void __thiscall Spi::flash_read_id(Spi *this)

{
  int local_120;
  int local_11c;
  int i;
  int len;
  uint8_t data [260];
  Spi *this_local;
  
  unique0x1000014d = this;
  memset(&i,0,0x104);
  i._0_1_ = 0x9f;
  local_11c = 5;
  if ((this->verbose & 1U) != 0) {
    fprintf(_stdout,"read flash ID..\n");
  }
  flash_chip_select(this);
  xfer_spi(this,(uint8_t *)&i,5);
  if ((byte)len == 0xff) {
    fprintf(_stderr,
            "Extended Device String Length is 0xFF, this is likely a read error. Ignorig...\n");
  }
  else if ((byte)len != 0) {
    local_11c = (byte)len + 5;
    xfer_spi(this,(uint8_t *)((long)&len + 1),(uint)(byte)len);
  }
  flash_chip_deselect(this);
  fprintf(_stdout,"flash ID:");
  for (local_120 = 1; local_120 < local_11c; local_120 = local_120 + 1) {
    fprintf(_stdout," 0x%02X",(ulong)*(byte *)((long)&i + (long)local_120));
  }
  fprintf(_stdout,"\n");
  return;
}

Assistant:

void Spi::flash_read_id() {
	/* JEDEC ID structure:
	 * Byte No. | Data Type
	 * ---------+----------
	 *        0 | FC_JEDECID Request Command
	 *        1 | MFG ID
	 *        2 | Dev ID 1
	 *        3 | Dev ID 2
	 *        4 | Ext Dev Str Len
	 */

	uint8_t data[260] = { FC_JEDECID };
	int len = 5; // command + 4 response bytes

	if (verbose)
		fprintf(stdout, "read flash ID..\n");

	flash_chip_select();

	// Write command and read first 4 bytes
	xfer_spi(data, len);

	if (data[4] == 0xFF)
		fprintf(stderr, "Extended Device String Length is 0xFF, "
				"this is likely a read error. Ignorig...\n");
	else {
		// Read extended JEDEC ID bytes
		if (data[4] != 0) {
			len += data[4];
			xfer_spi(data + 5, len - 5);
		}
	}

	flash_chip_deselect();

	fprintf(stdout, "flash ID:");
	for (int i = 1; i < len; i++)
		fprintf(stdout, " 0x%02X", data[i]);
	fprintf(stdout, "\n");
}